

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qurlrecode.cpp
# Opt level: O0

void ensureDetached(QString *result,char16_t **output,char16_t *begin,char16_t *input,char16_t *end,
                   int add)

{
  qsizetype qVar1;
  QChar *pQVar2;
  long in_RCX;
  long in_RDX;
  long *in_RSI;
  QString *in_RDI;
  int i;
  int origSize;
  int spaceNeeded;
  int charsRemaining;
  int charsProcessed;
  qsizetype in_stack_ffffffffffffffb8;
  undefined4 in_stack_ffffffffffffffc0;
  int iVar3;
  
  if (*in_RSI == 0) {
    qVar1 = QString::size(in_RDI);
    iVar3 = (int)qVar1;
    QString::resize((QString *)CONCAT44(iVar3,in_stack_ffffffffffffffc0),in_stack_ffffffffffffffb8);
    pQVar2 = QString::constData((QString *)0x31c13e);
    *in_RSI = (long)(pQVar2 + iVar3);
    for (iVar3 = 0; iVar3 < (int)(in_RCX - in_RDX >> 1); iVar3 = iVar3 + 1) {
      *(undefined2 *)(*in_RSI + (long)iVar3 * 2) = *(undefined2 *)(in_RDX + (long)iVar3 * 2);
    }
    *in_RSI = *in_RSI + (long)iVar3 * 2;
  }
  return;
}

Assistant:

static void ensureDetached(QString &result, char16_t *&output, const char16_t *begin, const char16_t *input, const char16_t *end,
                           int add = 0)
{
    if (!output) {
        // now detach
        // create enough space if the rest of the string needed to be percent-encoded
        int charsProcessed = input - begin;
        int charsRemaining = end - input;
        int spaceNeeded = end - begin + 2 * charsRemaining + add;
        int origSize = result.size();
        result.resize(origSize + spaceNeeded);

        // we know that resize() above detached, so we bypass the reference count check
        output = const_cast<char16_t *>(reinterpret_cast<const char16_t *>(result.constData()))
                 + origSize;

        // copy the chars we've already processed
        int i;
        for (i = 0; i < charsProcessed; ++i)
            output[i] = begin[i];
        output += i;
    }
}